

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_BucketAndBucketSize_Test<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_BucketAndBucketSize_Test<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  AssertHelper *this_00;
  char *pcVar2;
  HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *this_01;
  AssertHelper *this_02;
  AssertHelper *this_03;
  long in_RDI;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  size_type expected_bucknum;
  key_type *in_stack_fffffffffffffe58;
  BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffe60;
  unsigned_long *in_stack_fffffffffffffe68;
  char *in_stack_fffffffffffffe70;
  HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffe78;
  int iVar3;
  HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffe80;
  undefined8 in_stack_fffffffffffffe88;
  Type type;
  AssertionResult local_140;
  Message *in_stack_fffffffffffffed8;
  AssertHelper *in_stack_fffffffffffffee0;
  AssertionResult local_110 [2];
  key_type local_f0;
  size_type local_e8;
  AssertionResult local_e0 [6];
  value_type local_78;
  undefined4 in_stack_ffffffffffffff98;
  AssertionResult local_28;
  key_type local_18;
  size_type local_10;
  
  type = (Type)((ulong)in_stack_fffffffffffffe88 >> 0x20);
  this_00 = (AssertHelper *)(in_RDI + 0x10);
  local_18 = HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueKey(in_stack_fffffffffffffe78,(int)((ulong)in_stack_fffffffffffffe70 >> 0x20));
  local_10 = google::
             BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::bucket(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  google::
  BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::bucket_size(in_stack_fffffffffffffe60,(size_type)in_stack_fffffffffffffe58);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
             (uint *)in_stack_fffffffffffffe68,(unsigned_long *)in_stack_fffffffffffffe60);
  iVar3 = (int)((ulong)in_stack_fffffffffffffe78 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_28);
  if (!bVar1) {
    testing::Message::Message((Message *)this_00);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0xc9956c);
    type = (Type)((ulong)pcVar2 >> 0x20);
    testing::internal::AssertHelper::AssertHelper
              (this_00,type,(char *)in_stack_fffffffffffffe80,iVar3,in_stack_fffffffffffffe70);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe60);
    testing::Message::~Message((Message *)0xc995c9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc9963a);
  this_01 = (HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             *)(in_RDI + 0x10);
  local_78 = HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueObject(in_stack_fffffffffffffe80,(int)((ulong)this_01 >> 0x20));
  google::
  BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(local_78._4_8_,(value_type *)CONCAT44(local_78.first.first,in_stack_ffffffffffffff98));
  pcVar2 = (char *)(in_RDI + 0x10);
  local_f0 = HashtableTest<google::HashtableInterface_SparseHashMap<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueKey(this_01,(int)((ulong)in_stack_fffffffffffffe70 >> 0x20));
  local_e8 = google::
             BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::bucket(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((char *)this_01,in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
             (unsigned_long *)in_stack_fffffffffffffe60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_e0);
  if (!bVar1) {
    testing::Message::Message((Message *)this_00);
    in_stack_fffffffffffffe70 =
         testing::AssertionResult::failure_message((AssertionResult *)0xc9974a);
    testing::internal::AssertHelper::AssertHelper
              (this_00,type,pcVar2,(int)((ulong)this_01 >> 0x20),in_stack_fffffffffffffe70);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe60);
    testing::Message::~Message((Message *)0xc997a7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc99815);
  this_02 = (AssertHelper *)
            google::
            BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::bucket_size(in_stack_fffffffffffffe60,(size_type)in_stack_fffffffffffffe58);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)this_01,in_stack_fffffffffffffe70,(uint *)in_stack_fffffffffffffe68,
             (unsigned_long *)in_stack_fffffffffffffe60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_110);
  if (!bVar1) {
    testing::Message::Message((Message *)this_00);
    in_stack_fffffffffffffe68 =
         (unsigned_long *)testing::AssertionResult::failure_message((AssertionResult *)0xc998af);
    testing::internal::AssertHelper::AssertHelper
              (this_00,type,pcVar2,(int)((ulong)this_01 >> 0x20),in_stack_fffffffffffffe70);
    testing::internal::AssertHelper::operator=(this_02,in_stack_fffffffffffffed8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe60);
    testing::Message::~Message((Message *)0xc99903);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc9996e);
  google::
  BaseHashtableInterface<google::sparse_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::bucket_size(in_stack_fffffffffffffe60,(size_type)in_stack_fffffffffffffe58);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)this_01,in_stack_fffffffffffffe70,(uint *)in_stack_fffffffffffffe68,
             (unsigned_long *)in_stack_fffffffffffffe60);
  iVar3 = (int)((ulong)this_01 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_140);
  if (!bVar1) {
    testing::Message::Message((Message *)this_00);
    this_03 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0xc999f4)
    ;
    testing::internal::AssertHelper::AssertHelper
              (this_00,type,pcVar2,iVar3,in_stack_fffffffffffffe70);
    testing::internal::AssertHelper::operator=(this_02,in_stack_fffffffffffffed8);
    testing::internal::AssertHelper::~AssertHelper(this_03);
    testing::Message::~Message((Message *)0xc99a42);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc99aa4);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, BucketAndBucketSize) {
  const typename TypeParam::size_type expected_bucknum =
      this->ht_.bucket(this->UniqueKey(1));
  EXPECT_EQ(0u, this->ht_.bucket_size(expected_bucknum));

  this->ht_.insert(this->UniqueObject(1));
  EXPECT_EQ(expected_bucknum, this->ht_.bucket(this->UniqueKey(1)));
  EXPECT_EQ(1u, this->ht_.bucket_size(expected_bucknum));

  // Check that a bucket we didn't insert into, has a 0 size.  Since
  // we have an even number of buckets, bucknum^1 is guaranteed in range.
  EXPECT_EQ(0u, this->ht_.bucket_size(expected_bucknum ^ 1));
}